

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

void __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::push(iterator *this,node_ptr node,byte key_byte,uint8_t child_index,
                key_prefix_snapshot prefix)

{
  node_type nVar1;
  key_view v;
  key_prefix_snapshot local_40;
  byte local_38;
  uint8_t local_37;
  iterator *local_30;
  uint8_t local_22;
  byte local_21;
  uint8_t child_index_local;
  iterator *piStack_20;
  byte key_byte_local;
  iterator *this_local;
  key_prefix_snapshot prefix_local;
  node_ptr node_local;
  
  local_22 = child_index;
  local_21 = key_byte;
  piStack_20 = this;
  this_local = (iterator *)prefix;
  prefix_local = (key_prefix_snapshot)node.tagged_ptr;
  nVar1 = detail::basic_node_ptr<unodb::detail::node_header>::type
                    ((basic_node_ptr<unodb::detail::node_header> *)&prefix_local.f);
  if (nVar1 != LEAF) {
    local_40 = prefix_local;
    local_38 = local_21;
    local_37 = local_22;
    local_30 = this_local;
    std::
    stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
    ::push(&this->stack_,(value_type *)&local_40.f);
    v = detail::key_prefix_snapshot::get_key_view((key_prefix_snapshot *)&this_local);
    detail::key_buffer::push(&this->keybuf_,v);
    detail::key_buffer::push(&this->keybuf_,local_21);
    return;
  }
  __assert_fail("node.type() != node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                ,0x160,
                "void unodb::db<std::span<const std::byte>, std::span<const std::byte>>::iterator::push(detail::node_ptr, std::byte, std::uint8_t, detail::key_prefix_snapshot) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

void push(detail::node_ptr node, std::byte key_byte,
              std::uint8_t child_index, detail::key_prefix_snapshot prefix) {
      // For variable length keys we need to know the number of bytes
      // associated with the node's key_prefix.  In addition there is
      // one byte for the descent to the child node along the
      // child_index.  That information needs to be stored on the
      // stack so we can pop off the right number of bytes even for
      // OLC where the node might be concurrently modified.
      UNODB_DETAIL_ASSERT(node.type() != node_type::LEAF);
      stack_.push({node, key_byte, child_index, prefix});
      keybuf_.push(prefix.get_key_view());
      keybuf_.push(key_byte);
    }